

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O1

bool deqp::egl::compareRectangles(ConstPixelBufferAccess *rectA,ConstPixelBufferAccess *rectB)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  int z;
  int iVar10;
  int y;
  float local_50;
  float afStack_4c [4];
  float afStack_3c [3];
  
  iVar1 = (rectA->m_size).m_data[0];
  if ((rectB->m_size).m_data[0] == iVar1) {
    bVar4 = false;
    iVar2 = (rectA->m_size).m_data[1];
    if ((((rectB->m_size).m_data[1] == iVar2) &&
        (iVar3 = (rectA->m_size).m_data[2], (rectB->m_size).m_data[2] == iVar3)) &&
       (bVar4 = iVar3 < 1, 0 < iVar3)) {
      iVar10 = 0;
      do {
        if (0 < iVar2) {
          z = 0;
          bVar7 = 0 < iVar2;
          do {
            if (0 < iVar1) {
              y = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)(afStack_4c + 3),(int)rectA,y,z);
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)&local_50,(int)rectB,y,z);
                if ((afStack_4c[3] != local_50) || (NAN(afStack_4c[3]) || NAN(local_50))) {
LAB_00e40802:
                  if (bVar7) {
                    return bVar4;
                  }
                  goto LAB_00e40809;
                }
                uVar8 = 0xffffffffffffffff;
                while (uVar8 != 2) {
                  lVar5 = uVar8 + 5;
                  uVar9 = uVar8 + 1;
                  lVar6 = uVar8 + 1;
                  if ((afStack_4c[lVar5] != afStack_4c[lVar6]) ||
                     (uVar8 = uVar9, NAN(afStack_4c[lVar5]) || NAN(afStack_4c[lVar6])))
                  goto LAB_00e407e3;
                }
                uVar9 = 3;
LAB_00e407e3:
                if (uVar9 < 3) goto LAB_00e40802;
                y = y + 1;
              } while (y != iVar1);
            }
            z = z + 1;
            bVar7 = z < iVar2;
          } while (z != iVar2);
        }
LAB_00e40809:
        iVar10 = iVar10 + 1;
        bVar4 = iVar3 <= iVar10;
      } while (iVar10 != iVar3);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

virtual EGLenum				surfaceType	(void) const { return EGL_WINDOW_BIT; }